

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_relpath(char *dst,int size,char *path,char *start)

{
  code *pcVar1;
  int iVar2;
  char *pcVar3;
  int local_3c;
  int len;
  char *sub;
  char *start_local;
  char *path_local;
  int size_local;
  char *dst_local;
  
  if (start != dst) {
    pcVar3 = sx_strstr(path,start);
    if (pcVar3 == (char *)0x0) {
      dst_local = (char *)0x0;
    }
    else {
      local_3c = sx_strlen(start);
      if ((0 < local_3c) && ((pcVar3[local_3c] == '/' || (pcVar3[local_3c] == '\\')))) {
        local_3c = local_3c + 1;
      }
      dst_local = dst;
      if (path == dst) {
        iVar2 = sx_strlen(pcVar3 + local_3c);
        memmove(dst,pcVar3 + local_3c,(long)iVar2 + 1);
      }
      else {
        sx_strcpy(dst,size,pcVar3 + local_3c);
      }
    }
    return dst_local;
  }
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/os.c",0x263,
                    "start != dst");
  pcVar1 = (code *)swi(3);
  pcVar3 = (char *)(*pcVar1)();
  return pcVar3;
}

Assistant:

char* sx_os_path_relpath(char* dst, int size, const char* path, const char* start)
{
    sx_assert(start != dst);

    const char* sub = sx_strstr(path, start);
    if (sub) {
        int len = sx_strlen(start);
        if (len > 0 && (sub[len] == '/' || sub[len] == '\\'))
            len++;
        if (path != dst)
            sx_strcpy(dst, size, sub + len);
        else
            sx_memmove(dst, sub + len, (size_t)sx_strlen(sub + len) + 1);
        return dst;
    }
    return NULL;
}